

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::avx::BVH8BuilderTwoLevelInstanceArraySAH
                    (void *bvh,Scene *scene,GTypeMask gtype,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *this;
  
  this = (BVHNBuilderTwoLevel<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *)
         ::operator_new(0xa8);
  BVHNBuilderTwoLevel<8,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,gtype,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH8BuilderTwoLevelInstanceArraySAH (void* bvh, Scene* scene, Geometry::GTypeMask gtype, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,InstanceArray,InstanceArrayPrimitive>((BVH8*)bvh,scene,gtype,useMortonBuilder);
    }